

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iptables.c
# Opt level: O0

void print_chain(ip_chain_t *ipc)

{
  list_head *plVar1;
  char *pcVar2;
  list_head *__mptr_1;
  list_head *__mptr;
  ip_rule_t *p;
  ip_chain_t *ipc_local;
  
  printf("\tChain [%s]",ipc);
  if (ipc->policy == 6) {
    printf("\n");
  }
  else {
    pcVar2 = map_int_get_k(ipc->policy,m_target);
    printf(" (policy %s)\n",pcVar2);
  }
  for (plVar1 = (ipc->rules).next; __mptr = plVar1 + -5, plVar1 != &ipc->rules;
      plVar1 = plVar1->next) {
    printf("\t\t");
    print_rule((ip_rule_t *)__mptr);
  }
  printf("\n");
  return;
}

Assistant:

static void print_chain(ip_chain_t *ipc)
{
	printf("\tChain [%s]", ipc->name);

	if (ipc->policy != TARGET_NONE) {
		printf(" (policy %s)\n", map_int_get_k(ipc->policy, m_target));
	} else {
		printf("\n");
	}

	ip_rule_t *p = NULL;
	list_for_each_entry(p, &ipc->rules, list) {
		printf("\t\t");
		print_rule(p);
	}
	printf("\n");
}